

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::prim::AxisEnumHandler
            (expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *tok)

{
  initializer_list<std::pair<tinyusdz::Axis,_const_char_*>_> __l;
  pair<tinyusdz::Axis,_const_char_*> pVar1;
  allocator local_a1;
  string local_a0;
  allocator<std::pair<tinyusdz::Axis,_const_char_*>_> local_7d;
  Axis local_7c [3];
  pair<tinyusdz::Axis,_const_char_*> local_70;
  Axis local_60;
  char *local_58;
  Axis local_50;
  char *local_48;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<std::pair<tinyusdz::Axis,_const_char_*>,_std::allocator<std::pair<tinyusdz::Axis,_const_char_*>_>_>
  enums;
  string *tok_local;
  
  local_7c[2] = 0;
  enums.
  super__Vector_base<std::pair<tinyusdz::Axis,_const_char_*>,_std::allocator<std::pair<tinyusdz::Axis,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tok;
  pVar1 = ::std::make_pair<tinyusdz::Axis,char_const(&)[2]>(local_7c + 2,(char (*) [2])0x5947f4);
  local_70.second = pVar1.second;
  local_70.first = pVar1.first;
  local_7c[1] = 1;
  pVar1 = ::std::make_pair<tinyusdz::Axis,char_const(&)[2]>(local_7c + 1,(char (*) [2])0x5947e2);
  local_58 = pVar1.second;
  local_60 = pVar1.first;
  local_7c[0] = Z;
  pVar1 = ::std::make_pair<tinyusdz::Axis,char_const(&)[2]>(local_7c,(char (*) [2])0x5947be);
  local_48 = pVar1.second;
  local_50 = pVar1.first;
  local_40 = &local_70;
  local_38 = 3;
  ::std::allocator<std::pair<tinyusdz::Axis,_const_char_*>_>::allocator(&local_7d);
  __l._M_len = local_38;
  __l._M_array = local_40;
  ::std::
  vector<std::pair<tinyusdz::Axis,_const_char_*>,_std::allocator<std::pair<tinyusdz::Axis,_const_char_*>_>_>
  ::vector((vector<std::pair<tinyusdz::Axis,_const_char_*>,_std::allocator<std::pair<tinyusdz::Axis,_const_char_*>_>_>
            *)local_30,__l,&local_7d);
  ::std::allocator<std::pair<tinyusdz::Axis,_const_char_*>_>::~allocator(&local_7d);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_a0,"axis",&local_a1);
  anon_unknown_0::EnumHandler<tinyusdz::Axis>
            (__return_storage_ptr__,&local_a0,
             (string *)
             enums.
             super__Vector_base<std::pair<tinyusdz::Axis,_const_char_*>,_std::allocator<std::pair<tinyusdz::Axis,_const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::pair<tinyusdz::Axis,_const_char_*>,_std::allocator<std::pair<tinyusdz::Axis,_const_char_*>_>_>
              *)local_30);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  ::std::
  vector<std::pair<tinyusdz::Axis,_const_char_*>,_std::allocator<std::pair<tinyusdz::Axis,_const_char_*>_>_>
  ::~vector((vector<std::pair<tinyusdz::Axis,_const_char_*>,_std::allocator<std::pair<tinyusdz::Axis,_const_char_*>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::expected<Axis, std::string> AxisEnumHandler(const std::string &tok) {
  using EnumTy = std::pair<Axis, const char *>;
  const std::vector<EnumTy> enums = {
      std::make_pair(Axis::X, "X"),
      std::make_pair(Axis::Y,
                     "Y"),
      std::make_pair(Axis::Z, "Z"),
  };
  return EnumHandler<Axis>("axis", tok, enums);
}